

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

shared_ptr<mocker::ir::Addr> __thiscall
mocker::ir::Builder::makeNewNonarray(Builder *this,shared_ptr<mocker::ast::Type> *type)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  string *hint;
  _List_node_base *p_Var3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar5;
  size_t sVar6;
  long *plVar7;
  __node_base_ptr *pp_Var8;
  _List_node_base *p_Var9;
  shared_ptr<mocker::ast::Type> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  Builder *this_00;
  shared_ptr<mocker::ir::Addr> sVar11;
  shared_ptr<mocker::ir::Reg> instancePtr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ctorName;
  shared_ptr<mocker::ir::Addr> typeSize;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  _List_node_base local_88;
  shared_ptr<mocker::ir::Addr> local_78;
  __node_base_ptr *local_68;
  size_t local_60;
  __node_base_ptr local_58;
  ASTIDMap<std::shared_ptr<ast::Type>_> *pAStack_50;
  string local_48;
  
  this_00 = (Builder *)local_a8;
  peVar1 = (in_RDX->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    lVar5 = __dynamic_cast(peVar1,&ast::Type::typeinfo,&ast::ArrayType::typeinfo,0);
    if (lVar5 != 0) {
      p_Var2 = (in_RDX->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      __assert_fail("!std::dynamic_pointer_cast<ast::ArrayType>(type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                    ,0x3bc,
                    "std::shared_ptr<Addr> mocker::ir::Builder::makeNewNonarray(const std::shared_ptr<ast::Type> &) const"
                   );
    }
    lVar5 = __dynamic_cast(peVar1,&ast::Type::typeinfo,&ast::BuiltinType::typeinfo,0);
    if (lVar5 != 0) {
      p_Var2 = (in_RDX->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (*(int *)(lVar5 + 0x18) != 2) goto LAB_0013e0fe;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
        if (*(int *)(lVar5 + 0x18) != 2) {
LAB_0013e0fe:
          __assert_fail("p->type == ast::BuiltinType::String",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                        ,0x3be,
                        "std::shared_ptr<Addr> mocker::ir::Builder::makeNewNonarray(const std::shared_ptr<ast::Type> &) const"
                       );
        }
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
      }
    }
  }
  sVar6 = getTypeSize((Builder *)type,in_RDX);
  local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e9d60;
  local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e9db0;
  local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = (int)sVar6;
  local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = (int)(sVar6 >> 0x20);
  hint = (string *)
         (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  p_Var3 = (_List_node_base *)(local_a8 + 0x20);
  local_98._0_8_ = p_Var3;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a8 + 0x10),"instPtr","");
  BuilderContext::makeTempLocalReg((BuilderContext *)local_a8,hint);
  if ((_List_node_base *)local_98._0_8_ != p_Var3) {
    operator_delete((void *)local_98._0_8_,(long)local_88._M_next + 1);
  }
  BuilderContext::
  emplaceInst<mocker::ir::Malloc,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
            ((BuilderContext *)
             (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,(shared_ptr<mocker::ir::Reg> *)local_a8,&local_78);
  getTypeIdentifier_abi_cxx11_(&local_48,this_00,in_RDX);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x1aa789);
  pp_Var8 = (__node_base_ptr *)(plVar7 + 2);
  if ((__node_base_ptr *)*plVar7 == pp_Var8) {
    local_58 = *pp_Var8;
    pAStack_50 = (ASTIDMap<std::shared_ptr<ast::Type>_> *)plVar7[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *pp_Var8;
    local_68 = (__node_base_ptr *)*plVar7;
  }
  local_60 = plVar7[1];
  *plVar7 = (long)pp_Var8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_68);
  p_Var9 = (_List_node_base *)(plVar7 + 2);
  if ((_List_node_base *)*plVar7 == p_Var9) {
    local_88._M_next = p_Var9->_M_next;
    local_88._M_prev = (_List_node_base *)plVar7[3];
    local_98._0_8_ = p_Var3;
  }
  else {
    local_88._M_next = p_Var9->_M_next;
    local_98._0_8_ = (_List_node_base *)*plVar7;
  }
  local_98._8_8_ = plVar7[1];
  *plVar7 = (long)p_Var9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_68 != &local_58) {
    operator_delete(local_68,(ulong)((long)&local_58->_M_nxt + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,(ulong)(local_48.field_2._M_allocated_capacity + 1));
  }
  BuilderContext::
  emplaceInst<mocker::ir::Call,std::__cxx11::string&,std::shared_ptr<mocker::ir::Reg>&>
            ((BuilderContext *)
             (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a8 + 0x10),(shared_ptr<mocker::ir::Reg> *)local_a8);
  uVar4 = local_a8._8_8_;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)this = local_a8._0_8_;
  this->ctx = (BuilderContext *)uVar4;
  local_a8._0_8_ = (element_type *)0x0;
  _Var10._M_pi = extraout_RDX;
  if (((_List_node_base *)local_98._0_8_ != p_Var3) &&
     (operator_delete((void *)local_98._0_8_,(ulong)((long)&(local_88._M_next)->_M_next + 1)),
     _Var10._M_pi = extraout_RDX_00,
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    _Var10._M_pi = extraout_RDX_01;
  }
  if (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var10._M_pi = extraout_RDX_02;
  }
  sVar11.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  sVar11.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Addr>)
         sVar11.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr>
Builder::makeNewNonarray(const std::shared_ptr<ast::Type> &type) const {
  assert(!std::dynamic_pointer_cast<ast::ArrayType>(type));
  if (auto p = std::dynamic_pointer_cast<ast::BuiltinType>(type))
    assert(p->type == ast::BuiltinType::String);

  auto typeSize = makeILit((Integer)getTypeSize(type));
  auto instancePtr = ctx.makeTempLocalReg("instPtr");
  ctx.emplaceInst<Malloc>(instancePtr, typeSize);
  auto ctorName = "#" + getTypeIdentifier(type) + "#_ctor_";
  ctx.emplaceInst<Call>(ctorName, instancePtr);
  return instancePtr;
}